

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.c
# Opt level: O2

void sx__coro_yield(sx_coro_context *ctx,sx_fiber_t *pfrom,int nupdates)

{
  sx__coro_return(ctx,pfrom,CORO_RET_YIELD,nupdates);
  return;
}

Assistant:

void sx__coro_yield(sx_coro_context* ctx, sx_fiber_t* pfrom, int nupdates)
{
    sx__coro_return(ctx, pfrom, CORO_RET_YIELD, nupdates);
}